

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::processCommandInstruction(CoreBroker *this,ActionMessage *message)

{
  GlobalFederateId GVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  size_t __n;
  InterfaceHandle IVar2;
  route_id rVar3;
  int iVar4;
  string *this_00;
  iterator iVar5;
  pointer pBVar6;
  _func_int **pp_Var7;
  ulong uVar8;
  key_type local_30;
  
  GVar1.gid = (message->dest_id).gid;
  if (GVar1.gid == (this->super_BrokerBase).global_broker_id_local.gid) {
LAB_0034a40b:
    processLocalCommandInstruction(this,message);
    return;
  }
  if (GVar1.gid != 0) {
    rVar3 = getRoute(this,GVar1);
    UNRECOVERED_JUMPTABLE = (this->super_Broker)._vptr_Broker[0x23];
    (*UNRECOVERED_JUMPTABLE)(this,(ulong)(uint)rVar3.rid,message,UNRECOVERED_JUMPTABLE);
    return;
  }
  this_00 = ActionMessage::getString_abi_cxx11_(message,0);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_00,"broker");
  if ((iVar4 == 0) ||
     ((__n = this_00->_M_string_length, __n == (this->super_BrokerBase).identifier._M_string_length
      && ((__n == 0 ||
          (iVar4 = bcmp((this_00->_M_dataplus)._M_p,
                        (this->super_BrokerBase).identifier._M_dataplus._M_p,__n), iVar4 == 0))))))
  goto LAB_0034a40b;
  if ((this->super_BrokerBase).field_0x294 == '\x01') {
    iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (this_00,"federation");
    if ((iVar4 == 0) ||
       (iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(this_00,"root"), iVar4 == 0)) goto LAB_0034a40b;
    local_30._M_str = (this_00->_M_dataplus)._M_p;
    local_30._M_len = this_00->_M_string_length;
    iVar5 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(this->mFederates).lookup1,&local_30);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      pBVar6 = (pointer)(this->mFederates).dataStorage.
                        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pBVar6 = (pointer)((this->mFederates).dataStorage.
                         super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                        *(long *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                        ._M_cur + 0x18));
    }
    if (pBVar6 == (pointer)(this->mFederates).dataStorage.
                           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
      local_30._M_str = (this_00->_M_dataplus)._M_p;
      local_30._M_len = this_00->_M_string_length;
      iVar5 = std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(this->mBrokers).lookup1,&local_30);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar6 = (this->mBrokers).dataStorage.
                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar6 = (this->mBrokers).dataStorage.
                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 *(long *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x18);
      }
      if (pBVar6 == (this->mBrokers).dataStorage.
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        GVar1.gid = (message->source_id).gid;
        IVar2.hid = (message->source_handle).hid;
        message->source_id = (GlobalFederateId)(message->dest_id).gid;
        message->source_handle = (InterfaceHandle)(message->dest_handle).hid;
        message->dest_id = (GlobalFederateId)GVar1.gid;
        message->dest_handle = (InterfaceHandle)IVar2.hid;
        (message->source_id).gid = (this->super_BrokerBase).global_broker_id_local.gid;
        ActionMessage::setAction(message,cmd_error);
        SmallBuffer::operator=
                  (&message->payload,(char (*) [36])"unable to locate target for command");
        rVar3 = getRoute(this,(GlobalFederateId)(message->dest_id).gid);
        (*(this->super_Broker)._vptr_Broker[0x23])(this,(ulong)(uint)rVar3.rid,message);
        return;
      }
    }
  }
  else {
    local_30._M_str = (this_00->_M_dataplus)._M_p;
    local_30._M_len = __n;
    iVar5 = std::
            _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(this->mFederates).lookup1,&local_30);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      pBVar6 = (pointer)(this->mFederates).dataStorage.
                        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pBVar6 = (pointer)((this->mFederates).dataStorage.
                         super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start +
                        *(long *)((long)iVar5.
                                        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                        ._M_cur + 0x18));
    }
    if (pBVar6 == (pointer)(this->mFederates).dataStorage.
                           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish) {
      local_30._M_str = (this_00->_M_dataplus)._M_p;
      local_30._M_len = this_00->_M_string_length;
      iVar5 = std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&(this->mBrokers).lookup1,&local_30);
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar6 = (this->mBrokers).dataStorage.
                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar6 = (this->mBrokers).dataStorage.
                 super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 *(long *)((long)iVar5.
                                 super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                 ._M_cur + 0x18);
      }
      if (pBVar6 == (this->mBrokers).dataStorage.
                    super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        pp_Var7 = (this->super_Broker)._vptr_Broker;
        uVar8 = 0;
        goto LAB_0034a5ef;
      }
    }
  }
  uVar8 = (ulong)(uint)(pBVar6->route).rid;
  (message->dest_id).gid = ((GlobalFederateId *)&pBVar6->global_id)->gid;
  pp_Var7 = (this->super_Broker)._vptr_Broker;
LAB_0034a5ef:
  (*pp_Var7[0x23])(this,uVar8,message);
  return;
}

Assistant:

void CoreBroker::processCommandInstruction(ActionMessage& message)
{
    if (message.dest_id == global_broker_id_local) {
        processLocalCommandInstruction(message);
    } else if (message.dest_id == parent_broker_id) {
        const auto& target = message.getString(targetStringLoc);
        if (target == "broker" || target == getIdentifier()) {
            processLocalCommandInstruction(message);
        } else if (isRootc) {
            if (target == "federation" || target == "root") {
                processLocalCommandInstruction(message);
            } else {
                route_id route = parent_route_id;
                auto fed = mFederates.find(target);
                if (fed != mFederates.end()) {
                    route = fed->route;
                    message.dest_id = fed->global_id;
                    transmit(route, std::move(message));
                } else {
                    auto broker = mBrokers.find(target);
                    if (broker != mBrokers.end()) {
                        route = broker->route;
                        message.dest_id = broker->global_id;
                        transmit(route, std::move(message));
                    } else {
                        message.swapSourceDest();
                        message.source_id = global_broker_id_local;
                        message.setAction(CMD_ERROR);
                        message.payload = "unable to locate target for command";
                        transmit(getRoute(message.dest_id), std::move(message));
                    }
                }
            }
        } else {
            route_id route = parent_route_id;
            auto fed = mFederates.find(target);
            if (fed != mFederates.end()) {
                route = fed->route;
                message.dest_id = fed->global_id;
                transmit(route, std::move(message));
            } else {
                auto broker = mBrokers.find(target);
                if (broker != mBrokers.end()) {
                    route = broker->route;
                    message.dest_id = broker->global_id;
                    transmit(route, std::move(message));
                } else {
                    transmit(parent_route_id, std::move(message));
                }
            }
        }
    } else {
        transmit(getRoute(message.dest_id), std::move(message));
    }
}